

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  GetterXsYs<short> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  double dVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  uint uVar15;
  long lVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  pIVar13 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar4 = pGVar7->Count;
  lVar16 = (long)(((pGVar7->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride;
  sVar2 = *(short *)((long)pGVar7->Ys + lVar16);
  dVar18 = log10((double)(int)*(short *)((long)pGVar7->Xs + lVar16) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar14 = GImPlot;
  pIVar9 = pIVar13->CurrentPlot;
  dVar12 = (pIVar9->XAxis).Range.Min;
  iVar4 = pTVar8->YAxis;
  pGVar7 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  lVar16 = (long)(((prim + 1 + pGVar7->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar7->Stride;
  sVar3 = *(short *)((long)pGVar7->Ys + lVar16);
  IVar1 = pIVar13->PixelRange[iVar4].Min;
  fVar20 = (float)(pIVar13->Mx *
                   (((double)(float)(dVar18 / pIVar13->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar12) + dVar12) - dVar12) + (double)IVar1.x);
  fVar24 = (float)(pIVar13->My[iVar4] * ((double)(int)sVar2 - pIVar9->YAxis[iVar4].Range.Min) +
                  (double)IVar1.y);
  dVar18 = log10((double)(int)*(short *)((long)pGVar7->Xs + lVar16) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar14->CurrentPlot;
  dVar12 = (pIVar9->XAxis).Range.Min;
  iVar4 = pTVar8->YAxis;
  IVar1 = pIVar14->PixelRange[iVar4].Min;
  fVar17 = (float)(pIVar14->Mx *
                   (((double)(float)(dVar18 / pIVar14->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar12) + dVar12) - dVar12) + (double)IVar1.x);
  fVar19 = (float)(pIVar14->My[iVar4] * ((double)(int)sVar3 - pIVar9->YAxis[iVar4].Range.Min) +
                  (double)IVar1.y);
  fVar25 = (this->P12).x;
  fVar26 = (this->P12).y;
  fVar28 = (this->P11).x;
  fVar29 = (this->P11).y;
  fVar21 = fVar24 * fVar28 - fVar20 * fVar29;
  fVar30 = fVar25 * fVar19 - fVar26 * fVar17;
  fVar28 = fVar28 - fVar20;
  fVar25 = fVar25 - fVar17;
  fVar27 = fVar26 - fVar19;
  fVar31 = fVar27 * fVar28 - (fVar29 - fVar24) * fVar25;
  auVar22._0_4_ = fVar21 * fVar25 - fVar30 * fVar28;
  auVar22._4_4_ = fVar21 * fVar27 - fVar30 * (fVar29 - fVar24);
  auVar22._8_4_ = fVar24 * 0.0 - fVar26 * 0.0;
  auVar22._12_4_ = fVar24 * 0.0 - fVar26 * 0.0;
  auVar23._4_4_ = fVar31;
  auVar23._0_4_ = fVar31;
  auVar23._8_4_ = fVar27;
  auVar23._12_4_ = fVar27;
  auVar23 = divps(auVar22,auVar23);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10->col = this->Col;
  pIVar10[1].pos.x = fVar20;
  pIVar10[1].pos.y = fVar24;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[1].col = this->Col;
  pIVar10[2].pos = auVar23._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[2].col = this->Col;
  pIVar10[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[3].col = this->Col;
  pIVar10[4].uv.x = fVar17;
  pIVar10[4].uv.y = fVar19;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar10 + 5;
  uVar6 = DrawList->_VtxCurrentIdx;
  puVar11 = DrawList->_IdxWritePtr;
  *puVar11 = uVar6;
  uVar15 = -(uint)(fVar26 < fVar29 && fVar24 < fVar19 || fVar19 < fVar24 && fVar29 < fVar26) & 1;
  puVar11[1] = uVar6 + uVar15 + 1;
  puVar11[2] = DrawList->_VtxCurrentIdx + 3;
  puVar11[3] = DrawList->_VtxCurrentIdx + 1;
  puVar11[4] = (uVar15 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar11[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar11 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar20;
  (this->P11).y = fVar24;
  (this->P12).x = fVar17;
  (this->P12).y = fVar19;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }